

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopAdjustCost(WhereLoop *p,WhereLoop *pTemplate)

{
  int iVar1;
  WhereLoop *pTemplate_local;
  WhereLoop *p_local;
  
  pTemplate_local = p;
  if ((pTemplate->wsFlags & 0x200) != 0) {
    for (; pTemplate_local != (WhereLoop *)0x0; pTemplate_local = pTemplate_local->pNextLoop) {
      if ((pTemplate_local->iTab == pTemplate->iTab) && ((pTemplate_local->wsFlags & 0x200) != 0)) {
        iVar1 = whereLoopCheaperProperSubset(pTemplate_local,pTemplate);
        if (iVar1 == 0) {
          iVar1 = whereLoopCheaperProperSubset(pTemplate,pTemplate_local);
          if (iVar1 != 0) {
            pTemplate->rRun = pTemplate_local->rRun;
            pTemplate->nOut = pTemplate_local->nOut + 1;
          }
        }
        else {
          pTemplate->rRun = pTemplate_local->rRun;
          pTemplate->nOut = pTemplate_local->nOut + -1;
        }
      }
    }
  }
  return;
}

Assistant:

static void whereLoopAdjustCost(const WhereLoop *p, WhereLoop *pTemplate){
  if( (pTemplate->wsFlags & WHERE_INDEXED)==0 ) return;
  for(; p; p=p->pNextLoop){
    if( p->iTab!=pTemplate->iTab ) continue;
    if( (p->wsFlags & WHERE_INDEXED)==0 ) continue;
    if( whereLoopCheaperProperSubset(p, pTemplate) ){
      /* Adjust pTemplate cost downward so that it is cheaper than its 
      ** subset p. */
      WHERETRACE(0x80,("subset cost adjustment %d,%d to %d,%d\n",
                       pTemplate->rRun, pTemplate->nOut, p->rRun, p->nOut-1));
      pTemplate->rRun = p->rRun;
      pTemplate->nOut = p->nOut - 1;
    }else if( whereLoopCheaperProperSubset(pTemplate, p) ){
      /* Adjust pTemplate cost upward so that it is costlier than p since
      ** pTemplate is a proper subset of p */
      WHERETRACE(0x80,("subset cost adjustment %d,%d to %d,%d\n",
                       pTemplate->rRun, pTemplate->nOut, p->rRun, p->nOut+1));
      pTemplate->rRun = p->rRun;
      pTemplate->nOut = p->nOut + 1;
    }
  }
}